

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QList<QByteArray>>::
resolve<QtPromisePrivate::PromiseValue<QList<QByteArray>>const&>
          (PromiseData<QList<QByteArray>> *this,PromiseValue<QList<QByteArray>_> *value)

{
  PromiseValue<QList<QByteArray>_> local_28;
  PromiseValue<QList<QByteArray>_> *local_18;
  PromiseValue<QList<QByteArray>_> *value_local;
  PromiseData<QList<QByteArray>_> *this_local;
  
  local_18 = value;
  value_local = (PromiseValue<QList<QByteArray>_> *)this;
  PromiseValue<QList<QByteArray>_>::PromiseValue(&local_28,value);
  PromiseValue<QList<QByteArray>_>::operator=
            ((PromiseValue<QList<QByteArray>_> *)(this + 0x58),&local_28);
  PromiseValue<QList<QByteArray>_>::~PromiseValue(&local_28);
  PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::setSettled
            ((PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }